

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

void save_to_check_buffer_and_read_until_again
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  size_t sVar1;
  cio_error cVar2;
  
  sVar1 = first_check_buffer_pos;
  if (err == CIO_SUCCESS) {
    memcpy(first_check_buffer + first_check_buffer_pos,buffer->fetch_ptr,num_bytes);
    buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
    first_check_buffer_pos = sVar1 + num_bytes;
  }
  cVar2 = cio_buffered_stream_read_until
                    (bs,buffer,(char *)context,second_dummy_read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Call to read_at_least did not succeed!",0x167,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void save_to_check_buffer_and_read_until_again(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	char *second_delim = context;

	save_to_check_buffer(bs, context, err, buffer, num_bytes);
	err = cio_buffered_stream_read_until(bs, buffer, second_delim, second_dummy_read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Call to read_at_least did not succeed!");
}